

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

file_handle __thiscall
libtorrent::aux::part_file::open_file(part_file *this,open_mode_t mode,error_code *ec)

{
  undefined4 in_register_00000034;
  size_t *psVar1;
  char *in_R9;
  string_view name;
  string_view lhs;
  string_view rhs;
  string fn;
  
  psVar1 = (size_t *)CONCAT44(in_register_00000034,mode.m_val);
  lhs._M_str = (char *)psVar1[5];
  lhs._M_len = *psVar1;
  rhs._M_str = in_R9;
  rhs._M_len = psVar1[4];
  combine_path_abi_cxx11_(&fn,(libtorrent *)psVar1[1],lhs,rhs);
  name._M_str = fn._M_dataplus._M_p;
  name._M_len = fn._M_string_length;
  file_handle::file_handle((file_handle *)this,name,0,(open_mode_t)(uint)ec);
  ::std::__cxx11::string::~string((string *)&fn);
  return (file_handle)(handle_type)this;
}

Assistant:

aux::file_handle part_file::open_file(aux::open_mode_t const mode, error_code& ec) try
	{
		std::string const fn = combine_path(m_path, m_name);
		try {
			return aux::file_handle(fn, 0, mode);
		}
		catch (storage_error const& e)
		{
			if ((mode & aux::open_mode::write)
				&& e.ec == boost::system::errc::no_such_file_or_directory)
			{
				// this means the directory the file is in doesn't exist.
				// so create it
				ec.clear();
				create_directories(m_path, ec);
				if (ec) return {};
				return aux::file_handle(fn, 0, mode);
			}
			return {};
		}
	}
	catch (storage_error const& e)
	{
		ec = e.ec;
		return {};
	}